

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::InvocationCountShader::shadePrimitives
          (InvocationCountShader *this,GeometryEmitter *output,int verticesIn,
          PrimitivePacket *packets,int numPackets,int invocationID)

{
  Vec4 *a;
  Vector<float,_4> *pVVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float local_210;
  Vector<float,_4> local_1d4;
  Vec4 local_1c4;
  Vector<float,_4> local_1b4;
  Vec4 local_1a4;
  Vector<float,_4> local_194;
  Vec4 local_184;
  float local_174;
  int local_170;
  float subAngle;
  int ndx;
  GenericVec4 outColor;
  int numNgonVtx;
  undefined1 local_148 [8];
  Vec4 basePosition;
  Vec4 color;
  Vector<float,_4> local_118;
  Vector<float,_4> local_108;
  Vector<float,_4> local_f8;
  Vector<float,_4> local_e8;
  Vector<float,_4> local_d8;
  undefined1 local_c8 [8];
  GenericVec4 baseColor;
  GenericVec4 tipColor;
  undefined1 local_98 [8];
  Vec4 position2;
  undefined1 local_78 [8];
  Vec4 position1;
  undefined1 local_58 [8];
  Vec4 position0;
  VertexPacket *vertex;
  float l_radius;
  float l_angle;
  int packetNdx;
  int invocationID_local;
  int numPackets_local;
  PrimitivePacket *packets_local;
  int verticesIn_local;
  GeometryEmitter *output_local;
  InvocationCountShader *this_local;
  
  for (l_radius = 0.0; (int)l_radius < numPackets; l_radius = (float)((int)l_radius + 1)) {
    fVar2 = ((float)invocationID / (float)*(int *)&(this->super_ShaderProgram).field_0x154) * 5.5;
    position0.m_data._8_8_ = packets[(int)l_radius].vertices[0];
    if (this->m_testCase == CASE_FIXED_OUTPUT_COUNTS) {
      a = &((VertexPacket *)position0.m_data._8_8_)->position;
      fVar3 = deFloatCos(fVar2);
      fVar4 = deFloatSin(fVar2);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(position1.m_data + 2),fVar3 * 0.5,fVar4 * 0.5,0.0,0.0);
      tcu::operator+((tcu *)local_58,a,(Vector<float,_4> *)(position1.m_data + 2));
      pVVar1 = (Vector<float,_4> *)(position0.m_data._8_8_ + 8);
      fVar3 = deFloatCos(fVar2 + 0.1);
      fVar4 = deFloatSin(fVar2 + 0.1);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(position2.m_data + 2),fVar3 * 0.6,fVar4 * 0.6,0.0,0.0);
      tcu::operator+((tcu *)local_78,pVVar1,(Vector<float,_4> *)(position2.m_data + 2));
      pVVar1 = (Vector<float,_4> *)(position0.m_data._8_8_ + 8);
      fVar3 = deFloatCos(fVar2 - 0.1);
      fVar2 = deFloatSin(fVar2 - 0.1);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)((long)&tipColor.v + 8),fVar3 * 0.6,fVar2 * 0.6,0.0,0.0);
      tcu::operator+((tcu *)local_98,pVVar1,(Vector<float,_4> *)((long)&tipColor.v + 8));
      rr::GenericVec4::GenericVec4((GenericVec4 *)((long)&baseColor.v + 8));
      rr::GenericVec4::GenericVec4((GenericVec4 *)local_c8);
      tcu::Vector<float,_4>::Vector(&local_e8,1.0,1.0,0.0,1.0);
      rr::GenericVec4::get<float>((GenericVec4 *)&local_f8);
      tcu::operator*((tcu *)&local_d8,&local_e8,&local_f8);
      rr::GenericVec4::operator=((GenericVec4 *)((long)&baseColor.v + 8),&local_d8);
      tcu::Vector<float,_4>::Vector(&local_118,1.0,0.0,0.0,1.0);
      rr::GenericVec4::get<float>((GenericVec4 *)(color.m_data + 2));
      tcu::operator*((tcu *)&local_108,&local_118,(Vector<float,_4> *)(color.m_data + 2));
      rr::GenericVec4::operator=((GenericVec4 *)local_c8,&local_108);
      rr::GeometryEmitter::EmitVertex
                (output,(Vec4 *)local_58,0.0,(GenericVec4 *)((long)&baseColor.v + 8),
                 packets[(int)l_radius].primitiveIDIn);
      rr::GeometryEmitter::EmitVertex
                (output,(Vec4 *)local_78,0.0,(GenericVec4 *)local_c8,
                 packets[(int)l_radius].primitiveIDIn);
      rr::GeometryEmitter::EmitVertex
                (output,(Vec4 *)local_98,0.0,(GenericVec4 *)local_c8,
                 packets[(int)l_radius].primitiveIDIn);
      rr::GeometryEmitter::EndPrimitive(output);
    }
    else if (this->m_testCase == CASE_DIFFERENT_OUTPUT_COUNTS) {
      local_210 = 1.0;
      if ((int)((long)((ulong)(uint)((int)((long)invocationID / 2) >> 0x1f) << 0x20 |
                      (long)invocationID / 2 & 0xffffffffU) % 2) != 0) {
        local_210 = 0.0;
      }
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(basePosition.m_data + 2),(float)(invocationID % 2),local_210,
                 1.0,1.0);
      pVVar1 = (Vector<float,_4> *)(position0.m_data._8_8_ + 8);
      fVar3 = deFloatCos(fVar2);
      fVar2 = deFloatSin(fVar2);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)((long)&outColor.v + 0xc),fVar3 * 0.6,fVar2 * 0.6,0.0,0.0);
      tcu::operator+((tcu *)local_148,pVVar1,(Vector<float,_4> *)((long)&outColor.v + 0xc));
      outColor.v.uData[2] = invocationID + 3;
      rr::GenericVec4::GenericVec4((GenericVec4 *)&subAngle);
      rr::GenericVec4::operator=
                ((GenericVec4 *)&subAngle,(Vector<float,_4> *)(basePosition.m_data + 2));
      for (local_170 = 0; local_170 + 1 < outColor.v.iData[2]; local_170 = local_170 + 2) {
        local_174 = (((float)local_170 + 1.0) / (float)outColor.v.iData[2]) * 3.141;
        fVar2 = deFloatCos(local_174);
        fVar3 = deFloatSin(local_174);
        tcu::Vector<float,_4>::Vector(&local_194,fVar2 * 0.1,fVar3 * 0.1,0.0,0.0);
        tcu::operator+((tcu *)&local_184,(Vector<float,_4> *)local_148,&local_194);
        rr::GeometryEmitter::EmitVertex
                  (output,&local_184,0.0,(GenericVec4 *)&subAngle,
                   packets[(int)l_radius].primitiveIDIn);
        fVar2 = deFloatCos(local_174);
        fVar3 = deFloatSin(local_174);
        tcu::Vector<float,_4>::Vector(&local_1b4,fVar2 * 0.1,fVar3 * -0.1,0.0,0.0);
        tcu::operator+((tcu *)&local_1a4,(Vector<float,_4> *)local_148,&local_1b4);
        rr::GeometryEmitter::EmitVertex
                  (output,&local_1a4,0.0,(GenericVec4 *)&subAngle,
                   packets[(int)l_radius].primitiveIDIn);
      }
      if (outColor.v.iData[2] % 2 == 1) {
        tcu::Vector<float,_4>::Vector(&local_1d4,-0.1,0.0,0.0,0.0);
        tcu::operator+((tcu *)&local_1c4,(Vector<float,_4> *)local_148,&local_1d4);
        rr::GeometryEmitter::EmitVertex
                  (output,&local_1c4,0.0,(GenericVec4 *)&subAngle,
                   packets[(int)l_radius].primitiveIDIn);
      }
      rr::GeometryEmitter::EndPrimitive(output);
    }
  }
  return;
}

Assistant:

void InvocationCountShader::shadePrimitives (rr::GeometryEmitter& output, int verticesIn, const rr::PrimitivePacket* packets, const int numPackets, int invocationID) const
{
	DE_UNREF(verticesIn);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const float				l_angle		= float(invocationID) / float(m_numInvocations) * 5.5f;
		const float				l_radius	= 0.6f;

		const rr::VertexPacket*	vertex		= packets[packetNdx].vertices[0];

		if (m_testCase == CASE_FIXED_OUTPUT_COUNTS)
		{
			const tcu::Vec4			position0	= vertex->position + tcu::Vec4(deFloatCos(l_angle)      * (l_radius - 0.1f), deFloatSin(l_angle)      * (l_radius - 0.1f), 0.0f, 0.0f);
			const tcu::Vec4			position1	= vertex->position + tcu::Vec4(deFloatCos(l_angle+0.1f) * l_radius,          deFloatSin(l_angle+0.1f) * l_radius,          0.0f, 0.0f);
			const tcu::Vec4			position2	= vertex->position + tcu::Vec4(deFloatCos(l_angle-0.1f) * l_radius,          deFloatSin(l_angle-0.1f) * l_radius,          0.0f, 0.0f);

			rr::GenericVec4			tipColor;
			rr::GenericVec4			baseColor;

			tipColor  = tcu::Vec4(1.0, 1.0, 0.0, 1.0) * packets[packetNdx].vertices[0]->outputs[0].get<float>();
			baseColor = tcu::Vec4(1.0, 0.0, 0.0, 1.0) * packets[packetNdx].vertices[0]->outputs[0].get<float>();

			output.EmitVertex(position0, 0.0f, &tipColor, packets[packetNdx].primitiveIDIn);
			output.EmitVertex(position1, 0.0f, &baseColor, packets[packetNdx].primitiveIDIn);
			output.EmitVertex(position2, 0.0f, &baseColor, packets[packetNdx].primitiveIDIn);
			output.EndPrimitive();
		}
		else if (m_testCase == CASE_DIFFERENT_OUTPUT_COUNTS)
		{
			const tcu::Vec4 color			= tcu::Vec4(float(invocationID % 2), (((invocationID / 2) % 2) == 0) ? (1.0f) : (0.0f), 1.0f, 1.0f);
			const tcu::Vec4 basePosition	= vertex->position + tcu::Vec4(deFloatCos(l_angle) * l_radius, deFloatSin(l_angle) * l_radius, 0.0f, 0.0f);
			const int		numNgonVtx		= invocationID + 3;

			rr::GenericVec4	outColor;
			outColor = color;

			for (int ndx = 0; ndx + 1 < numNgonVtx; ndx += 2)
			{
				const float subAngle = (float(ndx) + 1.0f) / float(numNgonVtx) * 3.141f;

				output.EmitVertex(basePosition + tcu::Vec4(deFloatCos(subAngle) * 0.1f, deFloatSin(subAngle) *  0.1f, 0.0f, 0.0f), 0.0f, &outColor, packets[packetNdx].primitiveIDIn);
				output.EmitVertex(basePosition + tcu::Vec4(deFloatCos(subAngle) * 0.1f, deFloatSin(subAngle) * -0.1f, 0.0f, 0.0f), 0.0f, &outColor, packets[packetNdx].primitiveIDIn);
			}

			if ((numNgonVtx % 2) == 1)
				output.EmitVertex(basePosition + tcu::Vec4(-0.1f, 0.0f, 0.0f, 0.0f), 0.0f, &outColor, packets[packetNdx].primitiveIDIn);

			output.EndPrimitive();
		}
	}
}